

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_progress_bar_display.cpp
# Opt level: O0

void __thiscall duckdb::TerminalProgressBarDisplay::Finish(TerminalProgressBarDisplay *this)

{
  int32_t in_stack_0000004c;
  TerminalProgressBarDisplay *in_stack_00000050;
  OutputStream in_stack_ffffffffffffffc7;
  string *in_stack_ffffffffffffffc8;
  allocator in_stack_ffffffffffffffd7;
  string local_28 [40];
  
  PrintProgressInternal(in_stack_00000050,in_stack_0000004c);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_28,anon_var_dwarf_3eb6436 + 8,(allocator *)&stack0xffffffffffffffd7);
  Printer::RawPrint((OutputStream)in_stack_ffffffffffffffd7,in_stack_ffffffffffffffc8);
  ::std::__cxx11::string::~string(local_28);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  Printer::Flush(in_stack_ffffffffffffffc7);
  return;
}

Assistant:

void TerminalProgressBarDisplay::Finish() {
	PrintProgressInternal(100);
	Printer::RawPrint(OutputStream::STREAM_STDOUT, "\n");
	Printer::Flush(OutputStream::STREAM_STDOUT);
}